

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_div_mips64el(float16 a,float16 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float16 fVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  FloatParts FVar13;
  FloatParts FVar14;
  
  FVar13 = float16_unpack_canonical(a,status);
  uVar11 = FVar13._8_8_;
  uVar9 = FVar13.frac;
  FVar14 = float16_unpack_canonical(b,status);
  uVar6 = FVar14._8_8_;
  uVar12 = FVar14.frac;
  uVar7 = (uVar6 ^ uVar11) & 0x10000000000;
  uVar8 = FVar13._12_4_ & 0xff;
  uVar4 = FVar14._12_4_ & 0xff;
  if ((uVar8 == 2) && (uVar4 == 2)) {
    uVar6 = (ulong)((FVar13.exp - FVar14.exp) - (uint)(uVar9 < uVar12));
    lVar5 = 0;
    if (uVar12 <= uVar9) {
      lVar5 = uVar9 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12 * 2;
    auVar2._8_8_ = uVar9 >> (uVar12 <= uVar9);
    auVar2._0_8_ = lVar5;
    uVar9 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar11 = uVar11 & 0xffff00ff00000000;
  }
  else {
    if (((uVar11 | uVar6) & 0xfc00000000) != 0) {
      FVar14._8_8_ = uVar6 & 0xffffffffffff;
      FVar14.frac = uVar12;
      FVar13 = pick_nan(FVar13,FVar14,status);
      goto LAB_008201a0;
    }
    if (((uVar11 >> 0x20 & 1) != 0) && (uVar8 == uVar4)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar10 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar10 = 0x1fffffffffffffff;
      }
      FVar13.exp = 0x7fffffff;
      FVar13.cls = float_class_qnan;
      FVar13.sign = false;
      FVar13._14_2_ = 0;
      FVar13.frac = uVar10;
      goto LAB_008201a0;
    }
    if ((uVar11 >> 0x20 & 1) != 0) {
      uVar7 = uVar7 | uVar11 & 0xffff0003ffffffff;
      FVar13.exp = (int)uVar7;
      FVar13.cls = (char)(uVar7 >> 0x20);
      FVar13.sign = (_Bool)(char)(uVar7 >> 0x28);
      FVar13._14_2_ = (short)(uVar7 >> 0x30);
      FVar13.frac = uVar9;
      goto LAB_008201a0;
    }
    if (uVar4 == 3) {
      uVar12 = uVar11 & 0xffff0000ffffffff | uVar7 | 0x100000000;
      FVar13.exp = (int)uVar12;
      FVar13.cls = (char)(uVar12 >> 0x20);
      FVar13.sign = (_Bool)(char)(uVar12 >> 0x28);
      FVar13._14_2_ = (short)(uVar12 >> 0x30);
      FVar13.frac = uVar9;
      goto LAB_008201a0;
    }
    if (uVar4 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    status->float_exception_flags = status->float_exception_flags | 4;
    uVar11 = uVar11 & 0xffff0000ffffffff;
    uVar6 = 0x300000000;
  }
  uVar7 = uVar6 | uVar11 | uVar7;
  FVar13.exp = (int)uVar7;
  FVar13.cls = (char)(uVar7 >> 0x20);
  FVar13.sign = (_Bool)(char)(uVar7 >> 0x28);
  FVar13._14_2_ = (short)(uVar7 >> 0x30);
  FVar13.frac = uVar9;
LAB_008201a0:
  fVar3 = float16_round_pack_canonical(FVar13,status);
  return fVar3;
}

Assistant:

float16 float16_div(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}